

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_descriptor_handle.hpp
# Opt level: O2

file_descriptor_handle * __thiscall
io::posix::file_descriptor_handle::operator=
          (file_descriptor_handle *this,file_descriptor_handle *other)

{
  bool bVar1;
  int iVar2;
  
  if (other != this) {
    iVar2 = this->fd_;
    this->fd_ = other->fd_;
    other->fd_ = iVar2;
    bVar1 = this->delete_;
    this->delete_ = other->delete_;
    other->delete_ = bVar1;
  }
  return this;
}

Assistant:

file_descriptor_handle& operator=(file_descriptor_handle&& other) noexcept
    {
        if (&other != this) {
            std::swap(fd_, other.fd_);
            std::swap(delete_, other.delete_);
        }
        return *this;
    }